

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O1

int __thiscall basist::huffman_decoding_table::init(huffman_decoding_table *this,EVP_PKEY_CTX *ctx)

{
  int_vec *this_00;
  int16_vec *this_01;
  int *piVar1;
  short sVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  undefined8 extraout_RAX;
  uint in_ECX;
  ulong uVar6;
  long lVar7;
  char *__function;
  void *in_RDX;
  uint32_t new_size;
  uint uVar8;
  ulong __n;
  ulong uVar9;
  uint32_t new_size_1;
  uint min_new_capacity;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint min_new_capacity_00;
  ulong uVar14;
  ulong uVar15;
  uint32_t syms_using_codesize [32];
  uint32_t next_code [32];
  undefined8 local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  uint auStack_b0 [32];
  
  uVar10 = (uint)ctx;
  if (uVar10 == 0) {
    clear(this);
    uVar11 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
    __n = (ulong)ctx & 0xffffffff;
    uVar11 = (this->m_code_sizes).m_size;
    if (uVar11 != uVar10) {
      if (uVar11 <= uVar10) {
        if ((this->m_code_sizes).m_capacity < uVar10) {
          basisu::elemental_vector::increase_capacity
                    ((elemental_vector *)this,uVar10,uVar11 + 1 == uVar10,1,(object_mover)0x0,false)
          ;
        }
        uVar11 = (this->m_code_sizes).m_size;
        memset((this->m_code_sizes).m_p + uVar11,0,(ulong)(uVar10 - uVar11));
      }
      (this->m_code_sizes).m_size = uVar10;
    }
    if ((this->m_code_sizes).m_size == 0) {
      __function = "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]";
LAB_001546a1:
      __assert_fail("i < m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                    ,0x178,__function);
    }
    memcpy((this->m_code_sizes).m_p,in_RDX,__n);
    bVar3 = (byte)in_ECX & 0x1f;
    min_new_capacity_00 = 1 << bVar3;
    if ((this->m_lookup).m_size != 0) {
      (this->m_lookup).m_size = 0;
    }
    this_00 = &this->m_lookup;
    uVar11 = (this->m_lookup).m_size;
    if (uVar11 != min_new_capacity_00) {
      if (uVar11 <= min_new_capacity_00) {
        if ((this->m_lookup).m_capacity < min_new_capacity_00) {
          basisu::elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,min_new_capacity_00,
                     uVar11 + 1 == min_new_capacity_00,4,(object_mover)0x0,SUB41(0 << bVar3,0));
        }
        uVar11 = (this->m_lookup).m_size;
        memset((this->m_lookup).m_p + uVar11,0,(ulong)(min_new_capacity_00 - uVar11) << 2);
      }
      (this->m_lookup).m_size = min_new_capacity_00;
    }
    if ((this->m_tree).m_size != 0) {
      (this->m_tree).m_size = 0;
    }
    this_01 = &this->m_tree;
    uVar4 = uVar10 * 2;
    uVar11 = (this->m_tree).m_size;
    if (uVar11 != uVar4) {
      if (uVar11 <= uVar4) {
        if ((this->m_tree).m_capacity < uVar4) {
          basisu::elemental_vector::increase_capacity
                    ((elemental_vector *)this_01,uVar4,uVar11 + 1 == uVar4,2,(object_mover)0x0,false
                    );
        }
        uVar11 = (this->m_tree).m_size;
        memset((this->m_tree).m_p + uVar11,0,(ulong)(uVar4 - uVar11) * 2);
      }
      (this->m_tree).m_size = uVar4;
    }
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_128 = 0;
    uStack_120 = 0;
    local_138 = 0;
    uStack_130 = 0;
    uVar6 = 0;
    do {
      if (0x1f < (ulong)*(byte *)((long)in_RDX + uVar6)) goto LAB_0015434a;
      piVar1 = (int *)((long)&local_138 + (ulong)*(byte *)((long)in_RDX + uVar6) * 4);
      *piVar1 = *piVar1 + 1;
      uVar6 = uVar6 + 1;
    } while (uVar10 + (uVar10 == 0) != uVar6);
    local_b8 = 0;
    uVar4 = 0;
    lVar7 = 2;
    uVar11 = 0;
    do {
      iVar5 = *(int *)((long)&local_140 + lVar7 * 4 + 4);
      uVar4 = uVar4 + iVar5;
      uVar11 = (uVar11 + iVar5) * 2;
      auStack_b0[lVar7 + -2] = uVar11;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    if (uVar4 < 2) {
      uVar11 = CONCAT31((int3)(uVar4 >> 8),(int)uVar10 < 1);
      uVar6 = (ulong)uVar11;
      if (0 < (int)uVar10) {
        uVar10 = 0xffffffff;
        uVar15 = 0;
        local_140 = in_RDX;
        do {
          bVar3 = *(byte *)((long)in_RDX + uVar15);
          uVar14 = (ulong)bVar3;
          iVar5 = 10;
          if (bVar3 != 0) {
            uVar12 = (uint)bVar3;
            uVar11 = auStack_b0[uVar14 - 2];
            auStack_b0[uVar14 - 2] = uVar11 + 1;
            uVar9 = 0;
            uVar4 = uVar12;
            do {
              uVar8 = (uVar11 & 1) + (int)uVar9 * 2;
              uVar9 = (ulong)uVar8;
              uVar11 = uVar11 >> 1;
              uVar4 = uVar4 - 1;
            } while (uVar4 != 0);
            uVar11 = (uint)bVar3;
            if (in_ECX < uVar12) {
              uVar4 = uVar8 & min_new_capacity_00 - 1;
              if ((this->m_lookup).m_size <= uVar4) {
LAB_0015468c:
                __function = "T &basisu::vector<int>::operator[](size_t) [T = int]";
                goto LAB_001546a1;
              }
              uVar12 = this_00->m_p[uVar4];
              if (uVar12 == 0) {
                this_00->m_p[uVar4] = uVar10;
                uVar12 = uVar10;
                uVar10 = uVar10 - 2;
              }
              iVar5 = 1;
              in_RDX = local_140;
              if ((int)uVar12 < 0) {
                uVar8 = uVar8 >> ((byte)in_ECX - 1 & 0x1f);
                while ((int)(in_ECX + 1) < (int)uVar11) {
                  uVar12 = uVar12 - ((uVar8 >> 1 & 1) != 0);
                  if ((int)uVar12 < 0) {
                    min_new_capacity = -uVar12;
                    uVar13 = ~uVar12;
                    uVar4 = (this->m_tree).m_size;
                    if (uVar4 != min_new_capacity && (int)uVar4 <= (int)uVar13) {
                      if (uVar4 <= min_new_capacity) {
                        if ((this->m_tree).m_capacity < min_new_capacity) {
                          basisu::elemental_vector::increase_capacity
                                    ((elemental_vector *)this_01,min_new_capacity,
                                     uVar4 + 1 == min_new_capacity,2,(object_mover)0x0,false);
                        }
                        uVar4 = (this->m_tree).m_size;
                        memset((this->m_tree).m_p + uVar4,0,(ulong)(min_new_capacity - uVar4) * 2);
                      }
                      (this->m_tree).m_size = min_new_capacity;
                    }
                    if ((this->m_tree).m_size <= uVar13) goto LAB_001546ab;
                    sVar2 = this_01->m_p[uVar13];
                    uVar12 = (uint)sVar2;
                    if (sVar2 == 0) {
                      this_01->m_p[uVar13] = (short)uVar10;
                      bVar3 = 1;
                      uVar12 = uVar10;
                      uVar10 = uVar10 - 2;
                    }
                    else {
                      bVar3 = (byte)((ushort)sVar2 >> 0xf);
                    }
                  }
                  else {
                    bVar3 = 0;
                  }
                  uVar8 = uVar8 >> 1;
                  if (bVar3 == 0) {
                    iVar5 = 1;
                    goto LAB_0015458d;
                  }
                  uVar11 = (int)uVar14 - 1;
                  uVar14 = (ulong)uVar11;
                }
                iVar5 = 0x10;
LAB_0015458d:
                in_RDX = local_140;
                if ((int)uVar11 <= (int)(in_ECX + 1)) {
                  uVar12 = uVar12 - ((uVar8 >> 1 & 1) != 0);
                  uVar11 = -uVar12;
                  if ((int)uVar12 < 0) {
                    uVar4 = (this->m_tree).m_size;
                    if ((int)uVar4 < (int)uVar11) {
                      if (uVar4 <= uVar11) {
                        if ((this->m_tree).m_capacity < uVar11) {
                          basisu::elemental_vector::increase_capacity
                                    ((elemental_vector *)this_01,uVar11,uVar4 + 1 == uVar11,2,
                                     (object_mover)0x0,false);
                        }
                        uVar4 = (this->m_tree).m_size;
                        memset((this->m_tree).m_p + uVar4,0,(ulong)(uVar11 - uVar4) * 2);
                      }
                      (this->m_tree).m_size = uVar11;
                    }
                    uVar12 = ~uVar12;
                    if ((this->m_tree).m_size <= uVar12) {
LAB_001546ab:
                      __function = "T &basisu::vector<short>::operator[](size_t) [T = short]";
                      goto LAB_001546a1;
                    }
                    if (this_01->m_p[uVar12] == 0) {
                      this_01->m_p[uVar12] = (short)uVar15;
                      iVar5 = 0;
                      goto LAB_0015465c;
                    }
                  }
LAB_00154657:
                  iVar5 = 1;
                }
              }
            }
            else if (uVar8 < min_new_capacity_00) {
              do {
                if ((this->m_lookup).m_size <= (uint)uVar9) goto LAB_0015468c;
                if (this_00->m_p[uVar9] != 0) goto LAB_00154657;
                this_00->m_p[uVar9] = (uint)uVar15 | uVar12 << 0x10;
                uVar11 = (uint)uVar9 + (1 << (bVar3 & 0x1f));
                uVar9 = (ulong)uVar11;
              } while (uVar11 < min_new_capacity_00);
              iVar5 = 10;
            }
          }
LAB_0015465c:
          if ((iVar5 != 10) && (iVar5 != 0)) {
            return (int)uVar6;
          }
          uVar15 = uVar15 + 1;
          uVar6 = CONCAT71((int7)(uVar6 >> 8),__n <= uVar15);
          uVar11 = (uint)uVar6;
        } while (uVar15 != __n);
      }
    }
    else {
LAB_0015434a:
      uVar11 = 0;
    }
  }
  return uVar11;
}

Assistant:

bool init(uint32_t total_syms, const uint8_t *pCode_sizes, uint32_t fast_lookup_bits = basisu::cHuffmanFastLookupBits)
		{
			if (!total_syms)
			{
				clear();
				return true;
			}

			m_code_sizes.resize(total_syms);
			memcpy(&m_code_sizes[0], pCode_sizes, total_syms);

			const uint32_t huffman_fast_lookup_size = 1 << fast_lookup_bits;

			m_lookup.resize(0);
			m_lookup.resize(huffman_fast_lookup_size);

			m_tree.resize(0);
			m_tree.resize(total_syms * 2);

			uint32_t syms_using_codesize[basisu::cHuffmanMaxSupportedInternalCodeSize + 1];
			basisu::clear_obj(syms_using_codesize);
			for (uint32_t i = 0; i < total_syms; i++)
			{
				if (pCode_sizes[i] > basisu::cHuffmanMaxSupportedInternalCodeSize)
					return false;
				syms_using_codesize[pCode_sizes[i]]++;
			}

			uint32_t next_code[basisu::cHuffmanMaxSupportedInternalCodeSize + 1];
			next_code[0] = next_code[1] = 0;

			uint32_t used_syms = 0, total = 0;
			for (uint32_t i = 1; i < basisu::cHuffmanMaxSupportedInternalCodeSize; i++)
			{
				used_syms += syms_using_codesize[i];
				next_code[i + 1] = (total = ((total + syms_using_codesize[i]) << 1));
			}

			if (((1U << basisu::cHuffmanMaxSupportedInternalCodeSize) != total) && (used_syms > 1U))
				return false;

			for (int tree_next = -1, sym_index = 0; sym_index < (int)total_syms; ++sym_index)
			{
				uint32_t rev_code = 0, l, cur_code, code_size = pCode_sizes[sym_index];
				if (!code_size)
					continue;

				cur_code = next_code[code_size]++;

				for (l = code_size; l > 0; l--, cur_code >>= 1)
					rev_code = (rev_code << 1) | (cur_code & 1);

				if (code_size <= fast_lookup_bits)
				{
					uint32_t k = (code_size << 16) | sym_index;
					while (rev_code < huffman_fast_lookup_size)
					{
						if (m_lookup[rev_code] != 0)
						{
							// Supplied codesizes can't create a valid prefix code.
							return false;
						}

						m_lookup[rev_code] = k;
						rev_code += (1 << code_size);
					}
					continue;
				}

				int tree_cur;
				if (0 == (tree_cur = m_lookup[rev_code & (huffman_fast_lookup_size - 1)]))
				{
					const uint32_t idx = rev_code & (huffman_fast_lookup_size - 1);
					if (m_lookup[idx] != 0)
					{
						// Supplied codesizes can't create a valid prefix code.
						return false;
					}

					m_lookup[idx] = tree_next;
					tree_cur = tree_next;
					tree_next -= 2;
				}

				if (tree_cur >= 0)
				{
					// Supplied codesizes can't create a valid prefix code.
					return false;
				}

				rev_code >>= (fast_lookup_bits - 1);

				for (int j = code_size; j > ((int)fast_lookup_bits + 1); j--)
				{
					tree_cur -= ((rev_code >>= 1) & 1);

					const int idx = -tree_cur - 1;
					if (idx < 0)
						return false;
					else if (idx >= (int)m_tree.size())
						m_tree.resize(idx + 1);
										
					if (!m_tree[idx])
					{
						m_tree[idx] = (int16_t)tree_next;
						tree_cur = tree_next;
						tree_next -= 2;
					}
					else
					{
						tree_cur = m_tree[idx];
						if (tree_cur >= 0)
						{
							// Supplied codesizes can't create a valid prefix code.
							return false;
						}
					}
				}

				tree_cur -= ((rev_code >>= 1) & 1);

				const int idx = -tree_cur - 1;
				if (idx < 0)
					return false;
				else if (idx >= (int)m_tree.size())
					m_tree.resize(idx + 1);

				if (m_tree[idx] != 0)
				{
					// Supplied codesizes can't create a valid prefix code.
					return false;
				}

				m_tree[idx] = (int16_t)sym_index;
			}

			return true;
		}